

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O0

Cnf_Cut_t * Cnf_CutCompose(Cnf_Man_t *p,Cnf_Cut_t *pCut,Cnf_Cut_t *pCutFan,int iFan)

{
  byte bVar1;
  uint *pIn;
  uint *pIn_00;
  uint *pOut;
  int iVar2;
  uint uVar3;
  uint Phase;
  int iVar4;
  uint *puVar5;
  uint *puVar6;
  uint *pOut_00;
  Vec_Int_t *local_a0;
  Vec_Int_t *local_98;
  int RetValue;
  int nFanins;
  int iVar;
  int i;
  uint uPhaseFan;
  uint uPhase;
  uint *pTemp;
  uint *pFan;
  uint *pTop;
  uint *pTruthRes;
  uint *pTruthFan;
  uint *pTruth;
  Cnf_Cut_t *pCutRes;
  int iFan_local;
  Cnf_Cut_t *pCutFan_local;
  Cnf_Cut_t *pCut_local;
  Cnf_Man_t *p_local;
  
  pIn = p->pTruths[0];
  pIn_00 = p->pTruths[2];
  pOut = p->pTruths[3];
  RetValue = 0;
  while ((RetValue < pCut->nFanins &&
         (*(int *)((long)pCut[1].vIsop + (long)RetValue * 4 + -8) != iFan))) {
    RetValue = RetValue + 1;
  }
  if (RetValue < pCut->nFanins) {
    Cnf_CutRemoveIthVar(pCut,RetValue,iFan);
    iVar2 = Cnf_CutMergeLeaves(pCut,pCutFan,Cnf_CutCompose::pFanins);
    if (p->nMergeLimit < iVar2 + 1) {
      Cnf_CutInsertIthVar(pCut,RetValue,iFan);
      p_local = (Cnf_Man_t *)0x0;
    }
    else {
      p_local = (Cnf_Man_t *)Cnf_CutAlloc(p,iVar2);
      memcpy(&p_local->aArea,Cnf_CutCompose::pFanins,(long)iVar2 << 2);
      if ((int)pCut->nFanins + (int)pCutFan->nFanins < (int)*(char *)&p_local->pManAig) {
        __assert_fail("pCutRes->nFanins <= pCut->nFanins + pCutFan->nFanins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfCut.c"
                      ,0x140,"Cnf_Cut_t *Cnf_CutCompose(Cnf_Man_t *, Cnf_Cut_t *, Cnf_Cut_t *, int)"
                     );
      }
      puVar5 = Cnf_CutTruth(pCut);
      puVar6 = Cnf_CutTruth(pCutFan);
      pOut_00 = Cnf_CutTruth((Cnf_Cut_t *)p_local);
      for (nFanins = 0; iVar2 = (int)*(short *)((long)&p_local->pManAig + 2),
          SBORROW4(nFanins,iVar2 * 2) != nFanins + iVar2 * -2 < 0; nFanins = nFanins + 1) {
        pIn[nFanins] = puVar5[nFanins % (int)pCut->nWords];
      }
      for (nFanins = 0; nFanins < *(short *)((long)&p_local->pManAig + 2); nFanins = nFanins + 1) {
        pIn_00[nFanins] = puVar6[nFanins % (int)pCutFan->nWords];
      }
      uVar3 = Kit_BitMask(*(char *)&p_local->pManAig + 1);
      Kit_TruthShrink(pOut,pIn,(int)*(char *)&p_local->pManAig,*(char *)&p_local->pManAig + 1,
                      uVar3 & (1 << ((byte)RetValue & 0x1f) ^ 0xffffffffU),1);
      uVar3 = Cnf_TruthPhase((Cnf_Cut_t *)p_local,pCut);
      bVar1 = *(byte *)&p_local->pManAig;
      Phase = Cnf_TruthPhase((Cnf_Cut_t *)p_local,pCutFan);
      Kit_TruthStretch(pOut,pIn,pCut->nFanins + 1,*(char *)&p_local->pManAig + 1,
                       uVar3 | 1 << (bVar1 & 0x1f),1);
      Kit_TruthStretch(pOut,pIn_00,(int)pCutFan->nFanins,(int)*(char *)&p_local->pManAig,Phase,1);
      Kit_TruthMux(pOut_00,pIn,pIn + (int)*(short *)((long)&p_local->pManAig + 2),pIn_00,
                   (int)*(char *)&p_local->pManAig);
      Cnf_CutInsertIthVar(pCut,RetValue,iFan);
      if (*(char *)&p_local->pManAig < '\x05') {
        *(char *)((long)&p_local->pManAig + 1) =
             p->pSopSizes[*pOut_00 & 0xffff] + p->pSopSizes[(*pOut_00 ^ 0xffffffff) & 0xffff];
      }
      else {
        iVar2 = Kit_TruthIsop(pOut_00,(int)*(char *)&p_local->pManAig,p->vMemory,0);
        if (iVar2 == -1) {
          local_98 = (Vec_Int_t *)0x0;
        }
        else {
          local_98 = Vec_IntDup(p->vMemory);
        }
        p_local->pSops = (char **)local_98;
        Kit_TruthNot(pOut_00,pOut_00,(int)*(char *)&p_local->pManAig);
        iVar2 = Kit_TruthIsop(pOut_00,(int)*(char *)&p_local->pManAig,p->vMemory,0);
        if (iVar2 == -1) {
          local_a0 = (Vec_Int_t *)0x0;
        }
        else {
          local_a0 = Vec_IntDup(p->vMemory);
        }
        p_local->pSopSizes = (char *)local_a0;
        Kit_TruthNot(pOut_00,pOut_00,(int)*(char *)&p_local->pManAig);
        if (((Vec_Int_t *)p_local->pSopSizes == (Vec_Int_t *)0x0) ||
           (p_local->pSops == (char **)0x0)) {
          *(char *)((long)&p_local->pManAig + 1) = '\x7f';
        }
        else {
          iVar2 = Vec_IntSize((Vec_Int_t *)p_local->pSopSizes);
          iVar4 = Vec_IntSize((Vec_Int_t *)p_local->pSops);
          if (iVar2 + iVar4 < 0x80) {
            iVar2 = Vec_IntSize((Vec_Int_t *)p_local->pSopSizes);
            iVar4 = Vec_IntSize((Vec_Int_t *)p_local->pSops);
            *(char *)((long)&p_local->pManAig + 1) = (char)iVar2 + (char)iVar4;
          }
          else {
            *(char *)((long)&p_local->pManAig + 1) = '\x7f';
          }
        }
      }
    }
    return (Cnf_Cut_t *)p_local;
  }
  __assert_fail("iVar < pCut->nFanins",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfCut.c"
                ,0x133,"Cnf_Cut_t *Cnf_CutCompose(Cnf_Man_t *, Cnf_Cut_t *, Cnf_Cut_t *, int)");
}

Assistant:

Cnf_Cut_t * Cnf_CutCompose( Cnf_Man_t * p, Cnf_Cut_t * pCut, Cnf_Cut_t * pCutFan, int iFan )
{
    Cnf_Cut_t * pCutRes;
    static int pFanins[32];
    unsigned * pTruth, * pTruthFan, * pTruthRes;
    unsigned * pTop = p->pTruths[0], * pFan = p->pTruths[2], * pTemp = p->pTruths[3];
    unsigned uPhase, uPhaseFan;
    int i, iVar, nFanins, RetValue;

    // make sure the second cut is the fanin of the first
    for ( iVar = 0; iVar < pCut->nFanins; iVar++ )
        if ( pCut->pFanins[iVar] == iFan )
            break;
    assert( iVar < pCut->nFanins );
    // remove this variable
    Cnf_CutRemoveIthVar( pCut, iVar, iFan );
    // merge leaves of the cuts
    nFanins = Cnf_CutMergeLeaves( pCut, pCutFan, pFanins );
    if ( nFanins+1 > p->nMergeLimit )
    {
        Cnf_CutInsertIthVar( pCut, iVar, iFan );
        return NULL;
    }
    // create new cut
    pCutRes = Cnf_CutAlloc( p, nFanins );
    memcpy( pCutRes->pFanins, pFanins, sizeof(int) * nFanins );
    assert( pCutRes->nFanins <= pCut->nFanins + pCutFan->nFanins );

    // derive its truth table
    // get the truth tables in the composition space
    pTruth    = Cnf_CutTruth(pCut);
    pTruthFan = Cnf_CutTruth(pCutFan);
    pTruthRes = Cnf_CutTruth(pCutRes);
    for ( i = 0; i < 2*pCutRes->nWords; i++ )
        pTop[i] = pTruth[i % pCut->nWords];
    for ( i = 0; i < pCutRes->nWords; i++ )
        pFan[i] = pTruthFan[i % pCutFan->nWords];
    // move the variable to the end
    uPhase = Kit_BitMask( pCutRes->nFanins+1 ) & ~(1 << iVar);
    Kit_TruthShrink( pTemp, pTop, pCutRes->nFanins, pCutRes->nFanins+1, uPhase, 1 );
    // compute the phases
    uPhase    = Cnf_TruthPhase( pCutRes, pCut    ) | (1 << pCutRes->nFanins);
    uPhaseFan = Cnf_TruthPhase( pCutRes, pCutFan );
    // permute truth-tables to the common support
    Kit_TruthStretch( pTemp, pTop, pCut->nFanins+1,  pCutRes->nFanins+1, uPhase,    1 );
    Kit_TruthStretch( pTemp, pFan, pCutFan->nFanins, pCutRes->nFanins,   uPhaseFan, 1 );
    // perform Boolean operation
    Kit_TruthMux( pTruthRes, pTop, pTop+pCutRes->nWords, pFan, pCutRes->nFanins );
    // return the cut to its original condition
    Cnf_CutInsertIthVar( pCut, iVar, iFan );
    // consider the simple case
    if ( pCutRes->nFanins < 5 )
    {
        pCutRes->Cost = p->pSopSizes[0xFFFF & *pTruthRes] + p->pSopSizes[0xFFFF & ~*pTruthRes];
        return pCutRes;
    }

    // derive ISOP for positive phase
    RetValue = Kit_TruthIsop( pTruthRes, pCutRes->nFanins, p->vMemory, 0 );
    pCutRes->vIsop[1] = (RetValue == -1)? NULL : Vec_IntDup( p->vMemory );
    // derive ISOP for negative phase
    Kit_TruthNot( pTruthRes, pTruthRes, pCutRes->nFanins );
    RetValue = Kit_TruthIsop( pTruthRes, pCutRes->nFanins, p->vMemory, 0 );
    pCutRes->vIsop[0] = (RetValue == -1)? NULL : Vec_IntDup( p->vMemory );
    Kit_TruthNot( pTruthRes, pTruthRes, pCutRes->nFanins );

    // compute the cut cost
    if ( pCutRes->vIsop[0] == NULL || pCutRes->vIsop[1] == NULL )
        pCutRes->Cost = 127;
    else if ( Vec_IntSize(pCutRes->vIsop[0]) + Vec_IntSize(pCutRes->vIsop[1]) > 127 )
        pCutRes->Cost = 127;
    else
        pCutRes->Cost = Vec_IntSize(pCutRes->vIsop[0]) + Vec_IntSize(pCutRes->vIsop[1]);
    return pCutRes;
}